

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetIF.hpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
gmlc::netif::getInterfaceAddresses_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,netif *this,int family)

{
  IF_ADDRS addrs;
  int in_ECX;
  undefined4 in_register_00000014;
  IF_ADDRS allAddrs;
  string ipAddr;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  allAddrs = (IF_ADDRS)0x0;
  getifaddrs(&allAddrs,this,CONCAT44(in_register_00000014,family));
  for (addrs = allAddrs; addrs != (IF_ADDRS_UNICAST)0x0; addrs = getNextAddress((int)this,addrs)) {
    addressToString_abi_cxx11_(&ipAddr,(netif *)addrs->ifa_addr,(sockaddr *)0x10,in_ECX);
    if (ipAddr._M_string_length != 0) {
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)__return_storage_ptr__,(value_type *)&ipAddr);
    }
    std::__cxx11::string::~string((string *)&ipAddr);
  }
  if (allAddrs != (IF_ADDRS)0x0) {
    freeifaddrs();
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> getInterfaceAddresses(int family)
    {
        std::vector<std::string> result_list;

        IF_ADDRS allAddrs = NULL;

        getAddresses(family, &allAddrs);

#if defined(_WIN32) || defined(__USE_W32_SOCKETS)
        WSADATA wsaData;
        if (WSAStartup(0x202, &wsaData) != 0) {
            return result_list;
        }
        auto winAddrs = allAddrs;
        while (winAddrs) {
            auto addrs = winAddrs->FirstUnicastAddress;
#else
        auto addrs = allAddrs;
#endif

            for (auto a = addrs; a != NULL; a = getNextAddress(family, a)) {
                std::string ipAddr = addressToString(getSockAddr(a), getSockAddrLen(a));
                if (!ipAddr.empty()) {
                    result_list.push_back(ipAddr);
                }
            }

#if defined(_WIN32) || defined(__USE_W32_SOCKETS)
            winAddrs = winAddrs->Next;
        }
        WSACleanup();
#endif

        if (allAddrs) {
            freeAddresses(allAddrs);
        }
        return result_list;
    }